

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  string negative;
  string positive;
  char *dash;
  char *p;
  string *full_name;
  char *in_stack_fffffffffffffea0;
  string *psVar4;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  byte bVar5;
  char *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *local_70;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  
  std::operator+(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
  std::__cxx11::string::c_str();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffeaf,
                          CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)),
                 in_stack_fffffffffffffea0);
  std::__cxx11::string::~string(local_58);
  local_18 = local_38;
  local_70 = (char *)std::__cxx11::string::c_str();
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             strchr(local_70,0x2d);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_98,pcVar2);
    std::__cxx11::string::operator=(local_b8,"");
  }
  else {
    pcVar2 = local_70;
    this = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (in_stack_fffffffffffffec0,
               (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffeaf,
                        CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
    psVar4 = local_d8;
    std::__cxx11::string::operator=(local_98,psVar4);
    std::__cxx11::string::~string(psVar4);
    std::allocator<char>::~allocator(&local_d9);
    __a = &local_101;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
    std::__cxx11::string::operator=(local_b8,local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=(local_98,"*");
    }
  }
  std::__cxx11::string::c_str();
  bVar1 = MatchesFilter((string *)
                        CONCAT17(in_stack_fffffffffffffeaf,
                                 CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)),
                        in_stack_fffffffffffffea0);
  bVar5 = 0;
  if (bVar1) {
    psVar4 = local_18;
    std::__cxx11::string::c_str();
    bVar1 = MatchesFilter((string *)
                          CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffeae,
                                                  in_stack_fffffffffffffea8)),(char *)psVar4);
    bVar5 = bVar1 ^ 0xff;
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_38);
  return (bool)(bVar5 & 1);
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}